

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::EndColumns(void)

{
  ImGuiColumns *columns_00;
  ImDrawList *this;
  ImGuiContext *pIVar1;
  bool bVar2;
  ImGuiWindow *pIVar3;
  ImGuiColumnData *pIVar4;
  float fVar5;
  float _y;
  float fVar6;
  float fVar7;
  ImGuiCol local_98;
  int local_8c;
  float x_1;
  int n_1;
  ImVec2 local_80;
  float local_78;
  ImU32 local_74;
  float xi;
  ImU32 col;
  bool held;
  bool hovered;
  ImVec2 local_64;
  undefined1 local_5c [8];
  ImRect column_hit_rect;
  float column_hit_hw;
  ImGuiID column_id;
  float x;
  ImGuiColumnData *column;
  int local_30;
  int n;
  int dragging_column;
  float y2;
  float y1;
  bool is_being_resized;
  ImGuiColumns *columns;
  ImGuiWindow *window;
  ImGuiContext *g;
  
  pIVar1 = GImGui;
  pIVar3 = GetCurrentWindow();
  columns_00 = (pIVar3->DC).CurrentColumns;
  if (columns_00 == (ImGuiColumns *)0x0) {
    __assert_fail("columns != __null",
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.cpp"
                  ,0x21c0,"void ImGui::EndColumns()");
  }
  PopItemWidth();
  if (1 < columns_00->Count) {
    PopClipRect();
    ImDrawList::ChannelsMerge(pIVar3->DrawList);
  }
  fVar5 = ImMax<float>(columns_00->LineMaxY,(pIVar3->DC).CursorPos.y);
  columns_00->LineMaxY = fVar5;
  (pIVar3->DC).CursorPos.y = columns_00->LineMaxY;
  if ((columns_00->Flags & 0x10U) == 0) {
    (pIVar3->DC).CursorMaxPos.x = columns_00->BackupCursorMaxPosX;
  }
  y2._3_1_ = false;
  if (((columns_00->Flags & 1U) == 0) && ((pIVar3->SkipItems & 1U) == 0)) {
    fVar5 = ImMax<float>(columns_00->BackupCursorPosY,(pIVar3->ClipRect).Min.y);
    _y = ImMin<float>((pIVar3->DC).CursorPos.y,(pIVar3->ClipRect).Max.y);
    local_30 = -1;
    for (column._4_4_ = 1; column._4_4_ < columns_00->Count; column._4_4_ = column._4_4_ + 1) {
      pIVar4 = ImVector<ImGuiColumnData>::operator[](&columns_00->Columns,column._4_4_);
      fVar7 = (pIVar3->Pos).x;
      fVar6 = GetColumnOffset(column._4_4_);
      fVar7 = fVar7 + fVar6;
      column_hit_rect.Max.y = (float)(columns_00->ID + column._4_4_);
      column_hit_rect.Max.x = 4.0;
      ImVec2::ImVec2(&local_64,fVar7 - 4.0,fVar5);
      ImVec2::ImVec2((ImVec2 *)&col,fVar7 + 4.0,_y);
      ImRect::ImRect((ImRect *)local_5c,&local_64,(ImVec2 *)&col);
      KeepAliveID((ImGuiID)column_hit_rect.Max.y);
      bVar2 = IsClippedEx((ImRect *)local_5c,(ImGuiID)column_hit_rect.Max.y,false);
      if (!bVar2) {
        xi._3_1_ = 0;
        xi._2_1_ = 0;
        if ((columns_00->Flags & 2U) == 0) {
          ButtonBehavior((ImRect *)local_5c,(ImGuiID)column_hit_rect.Max.y,(bool *)((long)&xi + 3),
                         (bool *)((long)&xi + 2),0);
          if (((xi._3_1_ & 1) != 0) || ((xi._2_1_ & 1) != 0)) {
            pIVar1->MouseCursor = 4;
          }
          if (((xi._2_1_ & 1) != 0) && ((pIVar4->Flags & 2U) == 0)) {
            local_30 = column._4_4_;
          }
        }
        if ((xi._2_1_ & 1) == 0) {
          local_98 = 0x1b;
          if ((xi._3_1_ & 1) != 0) {
            local_98 = 0x1c;
          }
        }
        else {
          local_98 = 0x1d;
        }
        local_74 = GetColorU32(local_98,1.0);
        local_78 = (float)(int)fVar7;
        this = pIVar3->DrawList;
        ImVec2::ImVec2(&local_80,local_78,fVar5 + 1.0);
        ImVec2::ImVec2((ImVec2 *)&x_1,local_78,_y);
        ImDrawList::AddLine(this,&local_80,(ImVec2 *)&x_1,local_74,1.0);
      }
    }
    if (local_30 != -1) {
      if ((columns_00->IsBeingResized & 1U) == 0) {
        for (local_8c = 0; local_8c < columns_00->Count + 1; local_8c = local_8c + 1) {
          pIVar4 = ImVector<ImGuiColumnData>::operator[](&columns_00->Columns,local_8c);
          fVar5 = pIVar4->OffsetNorm;
          pIVar4 = ImVector<ImGuiColumnData>::operator[](&columns_00->Columns,local_8c);
          pIVar4->OffsetNormBeforeResize = fVar5;
        }
      }
      y2._3_1_ = true;
      columns_00->IsBeingResized = true;
      fVar5 = GetDraggedColumnOffset(columns_00,local_30);
      SetColumnOffset(local_30,fVar5);
    }
  }
  columns_00->IsBeingResized = y2._3_1_;
  (pIVar3->DC).CurrentColumns = (ImGuiColumns *)0x0;
  (pIVar3->DC).ColumnsOffset.x = 0.0;
  (pIVar3->DC).CursorPos.x =
       (float)(int)((pIVar3->Pos).x + (pIVar3->DC).Indent.x + (pIVar3->DC).ColumnsOffset.x);
  return;
}

Assistant:

void ImGui::EndColumns()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    ImGuiColumns* columns = window->DC.CurrentColumns;
    IM_ASSERT(columns != NULL);

    PopItemWidth();
    if (columns->Count > 1)
    {
        PopClipRect();
        window->DrawList->ChannelsMerge();
    }

    columns->LineMaxY = ImMax(columns->LineMaxY, window->DC.CursorPos.y);
    window->DC.CursorPos.y = columns->LineMaxY;
    if (!(columns->Flags & ImGuiColumnsFlags_GrowParentContentsSize))
        window->DC.CursorMaxPos.x = columns->BackupCursorMaxPosX;  // Restore cursor max pos, as columns don't grow parent

    // Draw columns borders and handle resize
    bool is_being_resized = false;
    if (!(columns->Flags & ImGuiColumnsFlags_NoBorder) && !window->SkipItems)
    {
        // We clip Y boundaries CPU side because very long triangles are mishandled by some GPU drivers.
        const float y1 = ImMax(columns->BackupCursorPosY, window->ClipRect.Min.y);
        const float y2 = ImMin(window->DC.CursorPos.y, window->ClipRect.Max.y);
        int dragging_column = -1;
        for (int n = 1; n < columns->Count; n++)
        {
            ImGuiColumnData* column = &columns->Columns[n];
            float x = window->Pos.x + GetColumnOffset(n);
            const ImGuiID column_id = columns->ID + ImGuiID(n);
            const float column_hit_hw = COLUMNS_HIT_RECT_HALF_WIDTH;
            const ImRect column_hit_rect(ImVec2(x - column_hit_hw, y1), ImVec2(x + column_hit_hw, y2));
            KeepAliveID(column_id);
            if (IsClippedEx(column_hit_rect, column_id, false))
                continue;

            bool hovered = false, held = false;
            if (!(columns->Flags & ImGuiColumnsFlags_NoResize))
            {
                ButtonBehavior(column_hit_rect, column_id, &hovered, &held);
                if (hovered || held)
                    g.MouseCursor = ImGuiMouseCursor_ResizeEW;
                if (held && !(column->Flags & ImGuiColumnsFlags_NoResize))
                    dragging_column = n;
            }

            // Draw column
            const ImU32 col = GetColorU32(held ? ImGuiCol_SeparatorActive : hovered ? ImGuiCol_SeparatorHovered : ImGuiCol_Separator);
            const float xi = (float)(int)x;
            window->DrawList->AddLine(ImVec2(xi, y1 + 1.0f), ImVec2(xi, y2), col);
        }

        // Apply dragging after drawing the column lines, so our rendered lines are in sync with how items were displayed during the frame.
        if (dragging_column != -1)
        {
            if (!columns->IsBeingResized)
                for (int n = 0; n < columns->Count + 1; n++)
                    columns->Columns[n].OffsetNormBeforeResize = columns->Columns[n].OffsetNorm;
            columns->IsBeingResized = is_being_resized = true;
            float x = GetDraggedColumnOffset(columns, dragging_column);
            SetColumnOffset(dragging_column, x);
        }
    }
    columns->IsBeingResized = is_being_resized;

    window->DC.CurrentColumns = NULL;
    window->DC.ColumnsOffset.x = 0.0f;
    window->DC.CursorPos.x = (float)(int)(window->Pos.x + window->DC.Indent.x + window->DC.ColumnsOffset.x);
}